

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O1

bool peparse::readChar16(bounded_buffer *b,uint32_t offset,char16_t *out)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long *plVar5;
  long *plVar6;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  long *local_50;
  long local_40;
  long lStack_38;
  string local_30;
  
  if (b == (bounded_buffer *)0x0) {
    err = 10;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121028);
    to_string<unsigned_int>(&local_30,0xac,f);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x121009);
    local_50 = &local_40;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_50);
  }
  else {
    uVar3 = (ulong)offset;
    if (uVar3 + 1 < (ulong)b->bufLen) {
      puVar1 = b->buf + uVar3;
      puVar2 = b->buf + uVar3 + 1;
      puVar4 = puVar2;
      if (b->swapBytes == false) {
        puVar4 = puVar1;
        puVar1 = puVar2;
      }
      *out = CONCAT11(*puVar1,*puVar4);
      return true;
    }
    err = 0xb;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121028);
    to_string<unsigned_int>(&local_30,0xb1,f_00);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x121009);
    local_50 = &local_40;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_50);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool readChar16(bounded_buffer *b, std::uint32_t offset, char16_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 1 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  char16_t tmp;
  if (b->swapBytes) {
    std::uint8_t tmpBuf[2];
    tmpBuf[0] = *(b->buf + offset + 1);
    tmpBuf[1] = *(b->buf + offset);
    memcpy(&tmp, tmpBuf, sizeof(std::uint16_t));
  } else {
    memcpy(&tmp, (b->buf + offset), sizeof(std::uint16_t));
  }
  out = tmp;

  return true;
}